

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

st__table * st__copy(st__table *old_table)

{
  int iVar1;
  st__table_entry **ppsVar2;
  st__compare_func_type p_Var3;
  st__hash_func_type p_Var4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  st__table *__ptr;
  st__table_entry **ppsVar10;
  st__table_entry *psVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  st__table_entry *psVar15;
  
  iVar1 = old_table->num_bins;
  __ptr = (st__table *)malloc(0x30);
  if (__ptr != (st__table *)0x0) {
    p_Var3 = old_table->compare;
    p_Var4 = old_table->hash;
    iVar6 = old_table->num_bins;
    iVar7 = old_table->num_entries;
    iVar8 = old_table->max_density;
    iVar9 = old_table->reorder_flag;
    ppsVar10 = old_table->bins;
    __ptr->grow_factor = old_table->grow_factor;
    __ptr->bins = ppsVar10;
    __ptr->num_bins = iVar6;
    __ptr->num_entries = iVar7;
    __ptr->max_density = iVar8;
    __ptr->reorder_flag = iVar9;
    __ptr->compare = p_Var3;
    __ptr->hash = p_Var4;
    ppsVar10 = (st__table_entry **)malloc((long)iVar1 * 8);
    __ptr->bins = ppsVar10;
    if (ppsVar10 != (st__table_entry **)0x0) {
      if (iVar1 < 1) {
        return __ptr;
      }
      ppsVar2 = old_table->bins;
      uVar12 = 1;
      lVar14 = 0;
      do {
        ppsVar10[lVar14] = (st__table_entry *)0x0;
        psVar15 = ppsVar2[lVar14];
LAB_0049610c:
        if (psVar15 != (st__table_entry *)0x0) {
          psVar11 = (st__table_entry *)malloc(0x18);
          if (psVar11 != (st__table_entry *)0x0) goto code_r0x00496120;
          uVar13 = 0;
          do {
            psVar15 = ppsVar10[uVar13];
            while (psVar15 != (st__table_entry *)0x0) {
              psVar11 = psVar15->next;
              free(psVar15);
              psVar15 = psVar11;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar12);
          free(ppsVar10);
          __ptr->bins = (st__table_entry **)0x0;
          break;
        }
        lVar14 = lVar14 + 1;
        uVar12 = uVar12 + 1;
        if (lVar14 == iVar1) {
          return __ptr;
        }
      } while( true );
    }
    free(__ptr);
  }
  return (st__table *)0x0;
code_r0x00496120:
  psVar11->next = psVar15->next;
  pcVar5 = psVar15->record;
  psVar11->key = psVar15->key;
  psVar11->record = pcVar5;
  psVar11->next = ppsVar10[lVar14];
  ppsVar10[lVar14] = psVar11;
  psVar15 = psVar15->next;
  goto LAB_0049610c;
}

Assistant:

st__table *
 st__copy( st__table *old_table)
{
    st__table *newEntry_table;
    st__table_entry *ptr, *newEntryptr, *next, *newEntry;
    int i, j, num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC( st__table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }
    
    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC( st__table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }
    for(i = 0; i < num_bins ; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
        newEntry = ABC_ALLOC( st__table_entry, 1);
        if (newEntry == NULL) {
        for (j = 0; j <= i; j++) {
            newEntryptr = newEntry_table->bins[j];
            while (newEntryptr != NULL) {
            next = newEntryptr->next;
            ABC_FREE(newEntryptr);
            newEntryptr = next;
            }
        }
        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}